

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O3

LY_ERR parse_choice(lysp_yang_ctx *ctx,lysp_node *parent,lysp_node **siblings)

{
  lysp_ext_instance **exts;
  lysp_node *plVar1;
  lyd_node *plVar2;
  LY_ERR LVar3;
  lysp_node *parent_00;
  lysp_node *plVar4;
  char *pcVar5;
  char **ppcVar6;
  char *format;
  ly_stmt parent_stmt;
  ly_ctx *plVar7;
  lysp_ext_instance **exts_00;
  ly_stmt kw;
  char *word;
  size_t word_len;
  char *buf;
  lysp_ext_instance **in_stack_ffffffffffffff70;
  ly_stmt local_84;
  char *local_80;
  size_t local_78;
  uint16_t *local_70;
  char **local_68;
  lysp_qname **local_60;
  char **local_58;
  uint16_t *local_50;
  char **local_48;
  lysp_node **local_40;
  lysp_ext_instance *local_38;
  
  parent_00 = (lysp_node *)calloc(1,0x68);
  if (parent_00 == (lysp_node *)0x0) {
    if (ctx == (lysp_yang_ctx *)0x0) {
      plVar7 = (ly_ctx *)0x0;
    }
    else {
      plVar7 = (ly_ctx *)
               **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    LVar3 = LY_EMEM;
    ly_log(plVar7,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","parse_choice");
  }
  else {
    plVar1 = *siblings;
    if (*siblings != (lysp_node *)0x0) {
      do {
        plVar4 = plVar1;
        plVar1 = plVar4->next;
      } while (plVar1 != (lysp_node *)0x0);
      siblings = &plVar4->next;
    }
    *siblings = parent_00;
    parent_00->nodetype = 2;
    parent_00->parent = parent;
    exts_00 = &local_38;
    LVar3 = get_argument(ctx,Y_IDENTIF_ARG,(uint16_t *)0x0,&local_80,(char **)exts_00,&local_78);
    if (LVar3 == LY_SUCCESS) {
      if (local_38 == (lysp_ext_instance *)0x0) {
        if (ctx == (lysp_yang_ctx *)0x0) {
          plVar7 = (ly_ctx *)0x0;
        }
        else {
          plVar7 = (ly_ctx *)
                   **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
        }
        pcVar5 = local_80;
        if (local_78 == 0) {
          pcVar5 = "";
        }
        LVar3 = lydict_insert(plVar7,pcVar5,local_78,&parent_00->name);
      }
      else {
        if (ctx == (lysp_yang_ctx *)0x0) {
          plVar7 = (ly_ctx *)0x0;
        }
        else {
          plVar7 = (ly_ctx *)
                   **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
        }
        LVar3 = lydict_insert_zc(plVar7,local_80,&parent_00->name);
      }
      if (((LVar3 == LY_SUCCESS) &&
          (LVar3 = get_keyword(ctx,&local_84,&local_80,&local_78), LVar3 == LY_SUCCESS)) &&
         (LVar3 = LY_SUCCESS, local_84 != LY_STMT_SYNTAX_SEMICOLON)) {
        if (local_84 == LY_STMT_SYNTAX_LEFT_BRACE) {
          LVar3 = get_keyword(ctx,&local_84,&local_80,&local_78);
          if ((LVar3 == LY_SUCCESS) && (LVar3 = LY_SUCCESS, local_84 != LY_STMT_SYNTAX_RIGHT_BRACE))
          {
            exts = &parent_00->exts;
            plVar1 = parent_00 + 1;
            local_40 = &parent_00[1].next;
            local_48 = &parent_00[1].dsc;
            local_50 = &parent_00[1].nodetype;
            local_70 = &parent_00->flags;
            local_58 = &parent_00->ref;
            local_60 = &parent_00->iffeatures;
            local_68 = &parent_00->dsc;
            do {
              if ((int)local_84 < 0x50000) {
                if ((int)local_84 < 0x400) {
                  if ((int)local_84 < 0x100) {
                    if (local_84 == LY_STMT_ANYDATA) {
                      plVar2 = (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
                      if (*(byte *)&plVar2[2].schema < 2) {
                        plVar7 = (ly_ctx *)**(undefined8 **)plVar2;
                        format = 
                        "Invalid keyword \"%s\" as a child of \"%s\" - the statement is allowed only in YANG 1.1 modules."
                        ;
                        pcVar5 = "anydata";
                        goto LAB_00176aa4;
                      }
                    }
                    else if (local_84 != LY_STMT_ANYXML) goto LAB_00176a1e;
                    LVar3 = parse_any(ctx,local_84,parent_00,&plVar1->parent);
                  }
                  else if (local_84 == LY_STMT_CASE) {
                    LVar3 = parse_case(ctx,parent_00,&plVar1->parent);
                  }
                  else {
                    if (local_84 != LY_STMT_CHOICE) goto LAB_00176a1e;
                    plVar2 = (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
                    if (*(byte *)&plVar2[2].schema < 2) {
                      plVar7 = (ly_ctx *)**(undefined8 **)plVar2;
                      format = 
                      "Invalid keyword \"%s\" as a child of \"%s\" - the statement is allowed only in YANG 1.1 modules."
                      ;
                      pcVar5 = "choice";
                      goto LAB_00176aa4;
                    }
                    LVar3 = parse_choice(ctx,parent_00,&plVar1->parent);
                  }
                }
                else if ((int)local_84 < 0x2000) {
                  if (local_84 == LY_STMT_CONTAINER) {
                    LVar3 = parse_container(ctx,parent_00,&plVar1->parent);
                  }
                  else {
                    if (local_84 != LY_STMT_LEAF) goto LAB_00176a1e;
                    LVar3 = parse_leaf(ctx,parent_00,&plVar1->parent);
                  }
                }
                else if (local_84 == LY_STMT_LEAF_LIST) {
                  LVar3 = parse_leaflist(ctx,parent_00,&plVar1->parent);
                }
                else {
                  if (local_84 != LY_STMT_LIST) goto LAB_00176a1e;
                  LVar3 = parse_list(ctx,parent_00,&plVar1->parent);
                }
LAB_00176972:
                if (LVar3 != LY_SUCCESS) {
                  return LVar3;
                }
              }
              else {
                if (0x12ffff < (int)local_84) {
                  if ((int)local_84 < 0x270000) {
                    if (local_84 == LY_STMT_IF_FEATURE) {
                      LVar3 = parse_qnames(ctx,LY_STMT_IF_FEATURE,local_60,(yang_arg)exts,exts_00);
                    }
                    else {
                      if (local_84 != LY_STMT_MANDATORY) goto LAB_00176a1e;
                      LVar3 = parse_mandatory(ctx,local_70,exts);
                    }
                  }
                  else {
                    if (local_84 == LY_STMT_REFERENCE) {
                      pcVar5 = *local_58;
                      parent_stmt = LY_STMT_REFERENCE;
                      ppcVar6 = local_58;
                      goto LAB_0017693b;
                    }
                    if (local_84 == LY_STMT_STATUS) {
                      LVar3 = parse_status(ctx,local_70,exts);
                    }
                    else {
                      if (local_84 != LY_STMT_WHEN) goto LAB_00176a1e;
                      LVar3 = parse_when(ctx,(lysp_when **)local_50);
                    }
                  }
                  goto LAB_00176972;
                }
                if (0x7ffff < (int)local_84) {
                  if (local_84 == LY_STMT_DESCRIPTION) {
                    pcVar5 = *local_68;
                    parent_stmt = LY_STMT_DESCRIPTION;
                    ppcVar6 = local_68;
LAB_0017693b:
                    exts_00 = (lysp_ext_instance **)0x2;
                    LVar3 = parse_text_field(ctx,pcVar5,parent_stmt,(uint32_t)ppcVar6,(char **)0x2,
                                             Y_IDENTIF_ARG,(uint16_t *)exts,
                                             in_stack_ffffffffffffff70);
                  }
                  else {
                    if (local_84 != LY_STMT_EXTENSION_INSTANCE) goto LAB_00176a1e;
                    exts_00 = (lysp_ext_instance **)0x200;
                    LVar3 = parse_ext(ctx,local_80,local_78,parent_00,LY_STMT_CHOICE,0,exts);
                  }
                  goto LAB_00176972;
                }
                if (local_84 == LY_STMT_CONFIG) {
                  LVar3 = parse_config(ctx,local_70,exts);
                  goto LAB_00176972;
                }
                if (local_84 != LY_STMT_DEFAULT) {
LAB_00176a1e:
                  if (ctx == (lysp_yang_ctx *)0x0) {
                    plVar7 = (ly_ctx *)0x0;
                  }
                  else {
                    plVar7 = (ly_ctx *)
                             **(undefined8 **)
                               (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
                  }
                  pcVar5 = lyplg_ext_stmt2str(local_84);
                  format = "Invalid keyword \"%s\" as a child of \"%s\".";
LAB_00176aa4:
                  ly_vlog(plVar7,(char *)0x0,LYVE_SYNTAX_YANG,format,pcVar5,"choice");
                  goto LAB_00176a13;
                }
                exts_00 = (lysp_ext_instance **)0x1;
                LVar3 = parse_text_field(ctx,local_40,LY_STMT_DEFAULT,(uint32_t)local_40,
                                         (char **)0x1,(yang_arg)local_48,(uint16_t *)exts,
                                         in_stack_ffffffffffffff70);
                if (LVar3 != LY_SUCCESS) {
                  return LVar3;
                }
                parent_00[1].name =
                     (char *)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
              }
              LVar3 = get_keyword(ctx,&local_84,&local_80,&local_78);
              if (LVar3 != LY_SUCCESS) {
                return LVar3;
              }
            } while (local_84 != LY_STMT_SYNTAX_RIGHT_BRACE);
            if ((*exts == (lysp_ext_instance *)0x0) ||
               (LVar3 = ly_set_add(&ctx->main_ctx->ext_inst,*exts,'\x01',(uint32_t *)0x0),
               LVar3 == LY_SUCCESS)) {
              LVar3 = LY_SUCCESS;
            }
          }
        }
        else {
          if (ctx == (lysp_yang_ctx *)0x0) {
            plVar7 = (ly_ctx *)0x0;
          }
          else {
            plVar7 = (ly_ctx *)
                     **(undefined8 **)
                       (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
          }
          pcVar5 = lyplg_ext_stmt2str(local_84);
          ly_vlog(plVar7,(char *)0x0,LYVE_SYNTAX_YANG,
                  "Invalid keyword \"%s\", expected \";\" or \"{\".",pcVar5);
LAB_00176a13:
          LVar3 = LY_EVALID;
        }
      }
    }
  }
  return LVar3;
}

Assistant:

LY_ERR
parse_choice(struct lysp_yang_ctx *ctx, struct lysp_node *parent, struct lysp_node **siblings)
{
    LY_ERR ret = LY_SUCCESS;
    char *buf, *word;
    size_t word_len;
    enum ly_stmt kw;
    struct lysp_node_choice *choice;

    /* create new choice structure */
    LY_LIST_NEW_RET(PARSER_CTX(ctx), siblings, choice, next, LY_EMEM);
    choice->nodetype = LYS_CHOICE;
    choice->parent = parent;

    /* get name */
    LY_CHECK_RET(get_argument(ctx, Y_IDENTIF_ARG, NULL, &word, &buf, &word_len));
    INSERT_WORD_GOTO(ctx, buf, choice->name, word, word_len, ret, cleanup);

    /* parse substatements */
    YANG_READ_SUBSTMT_FOR_GOTO(ctx, kw, word, word_len, ret, cleanup) {
        switch (kw) {
        case LY_STMT_CONFIG:
            LY_CHECK_RET(parse_config(ctx, &choice->flags, &choice->exts));
            break;
        case LY_STMT_DESCRIPTION:
            LY_CHECK_RET(parse_text_field(ctx, choice->dsc, LY_STMT_DESCRIPTION, 0, &choice->dsc, Y_STR_ARG, NULL,
                    &choice->exts));
            break;
        case LY_STMT_IF_FEATURE:
            LY_CHECK_RET(parse_qnames(ctx, LY_STMT_IF_FEATURE, &choice->iffeatures, Y_STR_ARG, &choice->exts));
            break;
        case LY_STMT_MANDATORY:
            LY_CHECK_RET(parse_mandatory(ctx, &choice->flags, &choice->exts));
            break;
        case LY_STMT_REFERENCE:
            LY_CHECK_RET(parse_text_field(ctx, choice->ref, LY_STMT_REFERENCE, 0, &choice->ref, Y_STR_ARG, NULL,
                    &choice->exts));
            break;
        case LY_STMT_STATUS:
            LY_CHECK_RET(parse_status(ctx, &choice->flags, &choice->exts));
            break;
        case LY_STMT_WHEN:
            LY_CHECK_RET(parse_when(ctx, &choice->when));
            break;
        case LY_STMT_DEFAULT:
            LY_CHECK_RET(parse_text_field(ctx, &choice->dflt, LY_STMT_DEFAULT, 0, &choice->dflt.str, Y_PREF_IDENTIF_ARG,
                    &choice->dflt.flags, &choice->exts));
            choice->dflt.mod = PARSER_CUR_PMOD(ctx);
            break;

        case LY_STMT_ANYDATA:
            PARSER_CHECK_STMTVER2_RET(ctx, "anydata", "choice");
        /* fall through */
        case LY_STMT_ANYXML:
            LY_CHECK_RET(parse_any(ctx, kw, (struct lysp_node *)choice, &choice->child));
            break;
        case LY_STMT_CASE:
            LY_CHECK_RET(parse_case(ctx, (struct lysp_node *)choice, &choice->child));
            break;
        case LY_STMT_CHOICE:
            PARSER_CHECK_STMTVER2_RET(ctx, "choice", "choice");
            LY_CHECK_RET(parse_choice(ctx, (struct lysp_node *)choice, &choice->child));
            break;
        case LY_STMT_CONTAINER:
            LY_CHECK_RET(parse_container(ctx, (struct lysp_node *)choice, &choice->child));
            break;
        case LY_STMT_LEAF:
            LY_CHECK_RET(parse_leaf(ctx, (struct lysp_node *)choice, &choice->child));
            break;
        case LY_STMT_LEAF_LIST:
            LY_CHECK_RET(parse_leaflist(ctx, (struct lysp_node *)choice, &choice->child));
            break;
        case LY_STMT_LIST:
            LY_CHECK_RET(parse_list(ctx, (struct lysp_node *)choice, &choice->child));
            break;
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(parse_ext(ctx, word, word_len, choice, LY_STMT_CHOICE, 0, &choice->exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(kw), "choice");
            return LY_EVALID;
        }
        YANG_READ_SUBSTMT_NEXT_ITER(ctx, kw, word, word_len, choice->exts, ret, cleanup);
    }

cleanup:
    return ret;
}